

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cc
# Opt level: O0

void __thiscall VehicleState::Propagator::Propagate(Propagator *this,double dt,bool intSTM)

{
  Scalar SVar1;
  double dVar2;
  Scalar *pSVar3;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *this_00;
  byte in_SIL;
  long in_RDI;
  double in_XMM0_Qa;
  VectorXd eigcol;
  vector<double,_std::allocator<double>_> col;
  int ii;
  MatrixXd STM;
  double t2;
  double t1;
  state_type xint;
  Propagator *in_stack_fffffffffffff9c8;
  controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_boost::numeric::odeint::default_error_checker<double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations>,_boost::numeric::odeint::default_step_adjuster<double,_double>,_boost::numeric::odeint::initially_resizer,_boost::numeric::odeint::explicit_error_stepper_fsal_tag>
  *in_stack_fffffffffffff9d0;
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  *in_stack_fffffffffffff9d8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9e0;
  value_type in_stack_fffffffffffff9e8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff9f0;
  vector<double,_std::allocator<double>_> *this_01;
  value_type vVar5;
  vector<double,_std::allocator<double>_> *this_02;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_03;
  algebra_type *in_stack_fffffffffffffa18;
  vector<double,_std::allocator<double>_> *__x;
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  *in_stack_fffffffffffffa20;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_431;
  undefined8 local_430;
  vector<double,_std::allocator<double>_> local_428;
  int local_40c;
  double in_stack_fffffffffffffc88;
  double in_stack_fffffffffffffc90;
  double in_stack_fffffffffffffc98;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffca0;
  Propagator *in_stack_fffffffffffffca8;
  controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_boost::numeric::odeint::default_error_checker<double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations>,_boost::numeric::odeint::default_step_adjuster<double,_double>,_boost::numeric::odeint::initially_resizer,_boost::numeric::odeint::explicit_error_stepper_fsal_tag>
  *in_stack_fffffffffffffcb0;
  vector<double,_std::allocator<double>_> local_30;
  byte local_11;
  double local_10;
  
  local_11 = in_SIL & 1;
  *(byte *)(in_RDI + 0x130) = local_11;
  local_10 = in_XMM0_Qa;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x134971);
  if ((local_11 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9d0,
               (size_type)in_stack_fffffffffffff9c8,(value_type_conflict1 *)0x134c94);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,1);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,2);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,3);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,4);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,5);
    *pvVar4 = SVar1;
  }
  else {
    std::vector<double,_std::allocator<double>_>::assign
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff9d0,
               (size_type)in_stack_fffffffffffff9c8,(value_type_conflict1 *)0x1349a5);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,1);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,2);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,3);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,4);
    *pvVar4 = SVar1;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
    SVar1 = *pSVar3;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,5);
    *pvVar4 = SVar1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,6);
    *pvVar4 = 1.0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0xd);
    *pvVar4 = 1.0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0x14);
    *pvVar4 = 1.0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0x1b);
    *pvVar4 = 1.0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0x22);
    *pvVar4 = 1.0;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0x29);
    *pvVar4 = 1.0;
  }
  dVar2 = *(double *)(in_RDI + 0x108);
  boost::numeric::odeint::
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ::runge_kutta_dopri5(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  boost::numeric::odeint::
  make_controlled<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,std::allocator<double>>,double,std::vector<double,std::allocator<double>>,double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations,boost::numeric::odeint::initially_resizer>>
            (in_stack_fffffffffffff9e8,(value_type)in_stack_fffffffffffff9e0,
             in_stack_fffffffffffff9d8);
  Propagator((Propagator *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  boost::numeric::odeint::
  integrate_adaptive<boost::numeric::odeint::controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,std::allocator<double>>,double,std::vector<double,std::allocator<double>>,double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations,boost::numeric::odeint::initially_resizer>,boost::numeric::odeint::default_error_checker<double,boost::numeric::odeint::range_algebra,boost::numeric::odeint::default_operations>,boost::numeric::odeint::default_step_adjuster<double,double>,boost::numeric::odeint::initially_resizer,boost::numeric::odeint::explicit_error_stepper_fsal_tag>,VehicleState::Propagator,std::vector<double,std::allocator<double>>,double>
            (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  ~Propagator((Propagator *)0x134f8a);
  boost::numeric::odeint::
  controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_boost::numeric::odeint::default_error_checker<double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations>,_boost::numeric::odeint::default_step_adjuster<double,_double>,_boost::numeric::odeint::initially_resizer,_boost::numeric::odeint::explicit_error_stepper_fsal_tag>
  ::~controlled_runge_kutta(in_stack_fffffffffffff9d0);
  boost::numeric::odeint::
  runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
  ::~runge_kutta_dopri5(&in_stack_fffffffffffff9d0->m_stepper);
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,0);
  vVar5 = *pvVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
  *pSVar3 = vVar5;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,1);
  vVar5 = *pvVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
  *pSVar3 = vVar5;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,2);
  vVar5 = *pvVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
  *pSVar3 = vVar5;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,3);
  vVar5 = *pvVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
  *pSVar3 = vVar5;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,4);
  vVar5 = *pvVar4;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
  *pSVar3 = vVar5;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&local_30,5);
  __x = (vector<double,_std::allocator<double>_> *)*pvVar4;
  this_00 = (vector<double,_std::allocator<double>_> *)
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                       in_stack_fffffffffffff9d0,(Index)in_stack_fffffffffffff9c8);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)__x;
  *(double *)(in_RDI + 0x108) = dVar2 + local_10;
  if ((local_11 & 1) != 0) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((Index)in_stack_fffffffffffff9d8,(Index)in_stack_fffffffffffff9d0);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff9d0,
               (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)in_stack_fffffffffffff9c8);
    for (local_40c = 0; local_40c < 6; local_40c = local_40c + 1) {
      local_430 = 0;
      this_03 = &local_431;
      std::allocator<double>::allocator((allocator<double> *)0x135223);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_fffffffffffff9f0,(size_type)in_stack_fffffffffffff9e8,
                 (value_type_conflict1 *)in_stack_fffffffffffff9e0,
                 (allocator_type *)in_stack_fffffffffffff9d8);
      std::allocator<double>::~allocator((allocator<double> *)0x135251);
      this_01 = &local_30;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(long)(local_40c * 6 + 6));
      in_stack_fffffffffffff9d0 =
           (controlled_runge_kutta<boost::numeric::odeint::runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>,_boost::numeric::odeint::default_error_checker<double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations>,_boost::numeric::odeint::default_step_adjuster<double,_double>,_boost::numeric::odeint::initially_resizer,_boost::numeric::odeint::explicit_error_stepper_fsal_tag>
            *)*pvVar4;
      this_02 = &local_428;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_02,0);
      *pvVar4 = (value_type)in_stack_fffffffffffff9d0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(long)(local_40c * 6 + 7));
      in_stack_fffffffffffff9d8 =
           (runge_kutta_dopri5<std::vector<double,_std::allocator<double>_>,_double,_std::vector<double,_std::allocator<double>_>,_double,_boost::numeric::odeint::range_algebra,_boost::numeric::odeint::default_operations,_boost::numeric::odeint::initially_resizer>
            *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_02,1);
      *pvVar4 = (value_type)in_stack_fffffffffffff9d8;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(long)(local_40c * 6 + 8));
      in_stack_fffffffffffff9e0 = (vector<double,_std::allocator<double>_> *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_02,2);
      *pvVar4 = (value_type)in_stack_fffffffffffff9e0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(long)(local_40c * 6 + 9));
      in_stack_fffffffffffff9e8 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_02,3);
      *pvVar4 = in_stack_fffffffffffff9e8;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(long)(local_40c * 6 + 10));
      in_stack_fffffffffffff9f0 = (vector<double,_std::allocator<double>_> *)*pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_02,4);
      *pvVar4 = (value_type)in_stack_fffffffffffff9f0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         (this_01,(long)(local_40c * 6 + 0xb));
      vVar5 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](this_02,5);
      *pvVar4 = vVar5;
      std::vector<double,_std::allocator<double>_>::vector(this_00,__x);
      Util::StdVec2Eigen(this_02);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9e0);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<int,int>
                (this_03,(Index)this_02,(Index)vVar5,(int)((ulong)this_01 >> 0x20),(int)this_01);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
                 in_stack_fffffffffffff9d0,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff9c8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x135477);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9e0);
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
              ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff9d0,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff9c8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x1355bd)
    ;
  }
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff9e0);
  return;
}

Assistant:

void Propagator::Propagate(double dt, bool intSTM){

		//set flag
		this->intSTM_ = intSTM;

		//build state
		state_type xint;
		if (intSTM) {
			xint.assign(42,0.0);
			xint[0] = this->pos_[0];
			xint[1] = this->pos_[1];
			xint[2] = this->pos_[2];
			xint[3] = this->vel_[0];
			xint[4] = this->vel_[1];
			xint[5] = this->vel_[2];

			//stm initialization
			xint[6] = 1.0;
			xint[13] = 1.0;
			xint[20] = 1.0;
			xint[27] = 1.0;
			xint[34] = 1.0;
			xint[41] = 1.0;

		} else {
			xint.assign(6,0.0);
			xint[0] = this->pos_[0];
			xint[1] = this->pos_[1];
			xint[2] = this->pos_[2];
			xint[3] = this->vel_[0];
			xint[4] = this->vel_[1];
			xint[5] = this->vel_[2];
		} //fi

		// std::cout << "before: " << this->pos_ << std::endl;

		//times
		double t1 = this->t_;
		double t2 = t1 + dt;

		//call integrator
		ode::integrate_adaptive( ode::make_controlled( this->abstol_ , this->reltol_ ,
			error_stepper_type() ) , *this , xint , t1 , t2 , this->dt_var_ );

		//update class members
		this->pos_[0] = xint[0];
		this->pos_[1] = xint[1];
		this->pos_[2] = xint[2];
		this->vel_[0] = xint[3];
		this->vel_[1] = xint[4];
		this->vel_[2] = xint[5];
		this->t_ = t2;

		//if we propagated the STM, write it out
		if(intSTM){
			Eigen::MatrixXd STM = Eigen::MatrixXd::Zero(6,6);

			for (int ii = 0; ii < 6; ++ii) {
				std::vector<double> col(6,0);
				col[0] = xint[6*ii + 0 + 6];
				col[1] = xint[6*ii + 1 + 6];
				col[2] = xint[6*ii + 2 + 6];
				col[3] = xint[6*ii + 3 + 6];
				col[4] = xint[6*ii + 4 + 6];
				col[5] = xint[6*ii + 5 + 6];

				//convert to eigen
				Eigen::VectorXd eigcol = Util::StdVec2Eigen(col);

				//assign
				STM.block(0,ii,6,1) = eigcol;

			} // for

			//update
			this->STM_ = STM;

		} //fi

		// std::cout << "after: "<< this->pos_ << std::endl;

	}